

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DUI.h
# Opt level: O1

void DUI_Update(void)

{
  byte bVar1;
  
  bVar1 = SDL_GetMouseState(&_duiMouse,0x146d64);
  _duiClicked = (_Bool)(_duiMouseDown ^ 1);
  if ((_Bool)(bVar1 & 1) == false) {
    _duiClicked = false;
  }
  _duiMouseDown = (_Bool)(bVar1 & 1);
  return;
}

Assistant:

void DUI_Update()
{
    int state = SDL_GetMouseState(&_duiMouse.x, &_duiMouse.y);
    bool pressed = (state & SDL_BUTTON(SDL_BUTTON_LEFT));
    _duiClicked = (pressed && !_duiMouseDown);
    _duiMouseDown = pressed;
}